

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_permute_axes<unsigned_char>
          (CImg<unsigned_char> *__return_storage_ptr__,CImg<unsigned_char> *this,char *axes_order,
          uchar *param_2)

{
  byte bVar1;
  uint size_z;
  uint size_x;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [12];
  unkbyte10 Var7;
  CImgArgumentException *this_00;
  uchar *puVar8;
  byte bVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  CImg<unsigned_char> *pCVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  long lVar21;
  long lVar22;
  uchar *puVar23;
  char cVar24;
  char cVar36;
  char cVar37;
  char cVar38;
  undefined1 auVar27 [16];
  undefined1 auVar32 [16];
  undefined1 local_58 [16];
  bool local_48;
  uchar *local_40;
  uchar s_code [4];
  uchar n_code [4];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar25 [12];
  undefined1 auVar28 [16];
  undefined1 auVar26 [13];
  undefined1 auVar29 [16];
  undefined1 auVar35 [16];
  undefined1 auVar31 [16];
  undefined1 auVar30 [16];
  undefined2 uVar39;
  
  puVar23 = this->_data;
  uVar13 = this->_width;
  uVar16 = this->_height;
  size_z = this->_depth;
  if (((size_z == 0 || uVar16 == 0) || (uVar13 == 0 || puVar23 == (uchar *)0x0)) ||
     (size_x = this->_spectrum, axes_order == (char *)0x0 || size_x == 0)) {
    CImg(__return_storage_ptr__,this,false);
    return __return_storage_ptr__;
  }
  local_40 = (uchar *)0x0;
  local_58 = ZEXT816(0);
  local_48 = false;
  s_code[0] = '\0';
  s_code[1] = '\x01';
  s_code[2] = '\x02';
  s_code[3] = '\x03';
  n_code[0] = '\0';
  n_code[1] = '\0';
  n_code[2] = '\0';
  n_code[3] = '\0';
  bVar1 = *axes_order;
  if (bVar1 == 0) {
    bVar9 = 0;
    pCVar15 = __return_storage_ptr__;
  }
  else {
    lVar10 = 0;
    bVar9 = bVar1;
    do {
      pCVar15 = (CImg<unsigned_char> *)(ulong)bVar9;
      bVar11 = bVar9 + 0x20;
      if ((byte)(bVar9 + 0xa5) < 0xe6) {
        bVar11 = bVar9;
      }
      if (lVar10 == 4) {
LAB_0018c130:
        s_code[0] = '\x04';
        bVar9 = 4;
        goto LAB_0018c137;
      }
      pCVar15 = (CImg<unsigned_char> *)(ulong)(bVar11 - 0x78);
      if ((2 < bVar11 - 0x78) && (bVar11 != 99)) goto LAB_0018c130;
      uVar12 = bVar11 & 3;
      n_code[uVar12] = n_code[uVar12] + '\x01';
      s_code[lVar10] = (uchar)uVar12;
      bVar9 = axes_order[lVar10 + 1];
      lVar10 = lVar10 + 1;
    } while (bVar9 != 0);
    bVar9 = s_code[0];
  }
LAB_0018c137:
  bVar11 = n_code[0];
  bVar2 = n_code[1];
  bVar3 = n_code[2];
  bVar4 = n_code[3];
  cVar24 = -((byte)((bVar11 == 0) * bVar11 | bVar11 != 0) == bVar11);
  cVar36 = -((byte)((bVar2 == 0) * bVar2 | bVar2 != 0) == bVar2);
  cVar37 = -((byte)((bVar3 == 0) * bVar3 | bVar3 != 0) == bVar3);
  cVar38 = -((byte)((bVar4 == 0) * bVar4 | bVar4 != 0) == bVar4);
  auVar25._0_11_ = ZEXT411(0xffffffff) << 0x38;
  auVar25[0xb] = 0xff;
  auVar26[0xc] = 0xff;
  auVar26._0_12_ = auVar25;
  auVar31[0xd] = 0xff;
  auVar31._0_13_ = auVar26;
  auVar31[0xe] = 0xff;
  auVar31[0xf] = 0xff;
  auVar30._14_2_ = auVar31._14_2_;
  auVar30[0xd] = 0xff;
  auVar30._0_13_ = auVar26;
  auVar29._13_3_ = auVar30._13_3_;
  auVar29[0xc] = 0xff;
  auVar29._0_12_ = auVar25;
  auVar28._12_4_ = auVar29._12_4_;
  auVar28[0xb] = 0xff;
  auVar28._0_11_ = auVar25._0_11_;
  Var7 = CONCAT91(CONCAT81((long)(CONCAT72((int7)(CONCAT63((int6)(CONCAT54(auVar28._11_5_,0xffffffff
                                                                          ) >> 0x18),0xffffff) >>
                                                 0x10),0xffff) >> 8),cVar38),cVar38);
  auVar6._2_10_ = Var7;
  auVar6[1] = cVar37;
  auVar6[0] = cVar37;
  auVar5._2_12_ = auVar6;
  auVar5[1] = cVar36;
  auVar5[0] = cVar36;
  auVar27._0_2_ = CONCAT11(cVar24,cVar24);
  auVar27._2_14_ = auVar5;
  uVar39 = (undefined2)Var7;
  auVar35._0_12_ = auVar27._0_12_;
  auVar35._12_2_ = uVar39;
  auVar35._14_2_ = uVar39;
  auVar34._12_4_ = auVar35._12_4_;
  auVar34._0_10_ = auVar27._0_10_;
  auVar34._10_2_ = auVar6._0_2_;
  auVar33._10_6_ = auVar34._10_6_;
  auVar33._0_8_ = auVar27._0_8_;
  auVar33._8_2_ = auVar6._0_2_;
  auVar32._8_8_ = auVar33._8_8_;
  auVar32._6_2_ = auVar5._0_2_;
  auVar32._4_2_ = auVar5._0_2_;
  auVar32._2_2_ = auVar27._0_2_;
  auVar32._0_2_ = auVar27._0_2_;
  iVar14 = movmskps((int)pCVar15,auVar32);
  if ((3 < bVar9 || bVar1 == 0) || iVar14 != 0xf) goto LAB_0018d30f;
  uVar12 = (uint)s_code >> 0x18 | ((uint)s_code >> 0x10 & 0xff) << 4 |
           ((uint)s_code >> 8 & 0xff) << 8 | (uint)bVar9 << 0xc;
  if (0x2012 < uVar12) {
    if (uVar12 < 0x3012) {
      if (uVar12 < 0x2130) {
        if (uVar12 == 0x2013) {
          assign((CImg<unsigned_char> *)local_58,size_z,uVar13,uVar16,size_x);
          uVar13 = this->_spectrum;
          if (0 < (int)uVar13) {
            uVar16 = this->_depth;
            lVar10 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar13 = this->_height;
                iVar14 = 0;
                do {
                  if (0 < (int)uVar13) {
                    uVar16 = this->_width;
                    lVar18 = 0;
                    do {
                      if (0 < (int)uVar16) {
                        lVar21 = 0;
                        do {
                          local_40[(ulong)(uint)local_58._8_4_ *
                                   (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ *
                                   lVar10 + (ulong)(uint)(local_58._0_4_ * (int)lVar21 + iVar14) +
                                            (ulong)(uint)local_58._4_4_ *
                                            (ulong)(uint)local_58._0_4_ * lVar18] = puVar23[lVar21];
                          uVar16 = this->_width;
                          lVar21 = lVar21 + 1;
                        } while ((int)lVar21 < (int)uVar16);
                        uVar13 = this->_height;
                        puVar23 = puVar23 + lVar21;
                      }
                      lVar18 = lVar18 + 1;
                    } while (lVar18 < (int)uVar13);
                    uVar16 = this->_depth;
                  }
                  iVar14 = iVar14 + 1;
                } while (iVar14 < (int)uVar16);
                uVar13 = this->_spectrum;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < (int)uVar13);
          }
        }
        else if (uVar12 == 0x2031) {
          assign((CImg<unsigned_char> *)local_58,size_z,uVar13,size_x,uVar16);
          uVar13 = this->_spectrum;
          if (0 < (int)uVar13) {
            uVar16 = this->_depth;
            lVar10 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar13 = this->_height;
                iVar14 = 0;
                do {
                  if (0 < (int)uVar13) {
                    uVar16 = this->_width;
                    lVar18 = 0;
                    do {
                      if (0 < (int)uVar16) {
                        lVar21 = 0;
                        do {
                          local_40[(ulong)(uint)local_58._8_4_ *
                                   (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ *
                                   lVar18 + (ulong)(uint)(local_58._0_4_ * (int)lVar21 + iVar14) +
                                            (ulong)(uint)local_58._4_4_ *
                                            (ulong)(uint)local_58._0_4_ * lVar10] = puVar23[lVar21];
                          uVar16 = this->_width;
                          lVar21 = lVar21 + 1;
                        } while ((int)lVar21 < (int)uVar16);
                        uVar13 = this->_height;
                        puVar23 = puVar23 + lVar21;
                      }
                      lVar18 = lVar18 + 1;
                    } while (lVar18 < (int)uVar13);
                    uVar16 = this->_depth;
                  }
                  iVar14 = iVar14 + 1;
                } while (iVar14 < (int)uVar16);
                uVar13 = this->_spectrum;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < (int)uVar13);
          }
        }
        else if (uVar12 == 0x2103) {
          assign((CImg<unsigned_char> *)local_58,size_z,uVar16,uVar13,size_x);
          uVar13 = this->_spectrum;
          if (0 < (int)uVar13) {
            uVar16 = this->_depth;
            lVar10 = 0;
            lVar18 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar13 = this->_height;
                iVar14 = 0;
                do {
                  if (0 < (int)uVar13) {
                    uVar19 = (ulong)this->_width;
                    iVar17 = 0;
                    do {
                      if (0 < (int)uVar19) {
                        lVar22 = 0;
                        lVar21 = lVar10;
                        do {
                          local_40[lVar21 + (ulong)(uint)(local_58._0_4_ * iVar17 + iVar14)] =
                               puVar23[lVar22];
                          lVar22 = lVar22 + 1;
                          uVar19 = (ulong)(int)this->_width;
                          lVar21 = lVar21 + (ulong)(uint)local_58._4_4_ *
                                            (ulong)(uint)local_58._0_4_;
                        } while (lVar22 < (long)uVar19);
                        uVar13 = this->_height;
                        puVar23 = puVar23 + lVar22;
                      }
                      iVar17 = iVar17 + 1;
                    } while (iVar17 < (int)uVar13);
                    uVar16 = this->_depth;
                  }
                  iVar14 = iVar14 + 1;
                } while (iVar14 < (int)uVar16);
                uVar13 = this->_spectrum;
              }
              lVar18 = lVar18 + 1;
              lVar10 = lVar10 + (ulong)(uint)local_58._8_4_ *
                                (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
            } while (lVar18 < (int)uVar13);
          }
        }
      }
      else if (uVar12 == 0x2130) {
        assign((CImg<unsigned_char> *)local_58,size_z,uVar16,size_x,uVar13);
        uVar13 = this->_spectrum;
        if (0 < (int)uVar13) {
          uVar16 = this->_depth;
          lVar10 = 0;
          lVar18 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar13 = this->_height;
              iVar14 = 0;
              do {
                if (0 < (int)uVar13) {
                  uVar19 = (ulong)this->_width;
                  iVar17 = 0;
                  do {
                    if (0 < (int)uVar19) {
                      lVar22 = 0;
                      lVar21 = lVar10;
                      do {
                        local_40[lVar21 + (ulong)(uint)(local_58._0_4_ * iVar17 + iVar14)] =
                             puVar23[lVar22];
                        lVar22 = lVar22 + 1;
                        uVar19 = (ulong)(int)this->_width;
                        lVar21 = lVar21 + (ulong)(uint)local_58._8_4_ *
                                          (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
                      } while (lVar22 < (long)uVar19);
                      uVar13 = this->_height;
                      puVar23 = puVar23 + lVar22;
                    }
                    iVar17 = iVar17 + 1;
                  } while (iVar17 < (int)uVar13);
                  uVar16 = this->_depth;
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 < (int)uVar16);
              uVar13 = this->_spectrum;
            }
            lVar18 = lVar18 + 1;
            lVar10 = lVar10 + (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
          } while (lVar18 < (int)uVar13);
        }
      }
      else if (uVar12 == 0x2301) {
        assign((CImg<unsigned_char> *)local_58,size_z,size_x,uVar13,uVar16);
        uVar13 = this->_spectrum;
        if (0 < (int)uVar13) {
          uVar16 = this->_depth;
          iVar14 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar13 = this->_height;
              iVar17 = 0;
              do {
                if (0 < (int)uVar13) {
                  uVar19 = (ulong)this->_width;
                  lVar10 = 0;
                  lVar18 = 0;
                  do {
                    if (0 < (int)uVar19) {
                      lVar22 = 0;
                      lVar21 = lVar10;
                      do {
                        local_40[lVar21 + (ulong)(uint)(local_58._0_4_ * iVar14 + iVar17)] =
                             puVar23[lVar22];
                        lVar22 = lVar22 + 1;
                        uVar19 = (ulong)(int)this->_width;
                        lVar21 = lVar21 + (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
                      } while (lVar22 < (long)uVar19);
                      uVar13 = this->_height;
                      puVar23 = puVar23 + lVar22;
                    }
                    lVar18 = lVar18 + 1;
                    lVar10 = lVar10 + (ulong)(uint)local_58._8_4_ *
                                      (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
                  } while (lVar18 < (int)uVar13);
                  uVar16 = this->_depth;
                }
                iVar17 = iVar17 + 1;
              } while (iVar17 < (int)uVar16);
              uVar13 = this->_spectrum;
            }
            iVar14 = iVar14 + 1;
          } while (iVar14 < (int)uVar13);
        }
      }
      else if (uVar12 == 0x2310) {
        assign((CImg<unsigned_char> *)local_58,size_z,size_x,uVar16,uVar13);
        uVar13 = this->_spectrum;
        if (0 < (int)uVar13) {
          uVar16 = this->_depth;
          iVar14 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar13 = this->_height;
              iVar17 = 0;
              do {
                if (0 < (int)uVar13) {
                  uVar19 = (ulong)this->_width;
                  lVar10 = 0;
                  lVar18 = 0;
                  do {
                    if (0 < (int)uVar19) {
                      lVar22 = 0;
                      lVar21 = lVar10;
                      do {
                        local_40[lVar21 + (ulong)(uint)(local_58._0_4_ * iVar14 + iVar17)] =
                             puVar23[lVar22];
                        lVar22 = lVar22 + 1;
                        uVar19 = (ulong)(int)this->_width;
                        lVar21 = lVar21 + (ulong)(uint)local_58._8_4_ *
                                          (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
                      } while (lVar22 < (long)uVar19);
                      uVar13 = this->_height;
                      puVar23 = puVar23 + lVar22;
                    }
                    lVar18 = lVar18 + 1;
                    lVar10 = lVar10 + (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
                  } while (lVar18 < (int)uVar13);
                  uVar16 = this->_depth;
                }
                iVar17 = iVar17 + 1;
              } while (iVar17 < (int)uVar16);
              uVar13 = this->_spectrum;
            }
            iVar14 = iVar14 + 1;
          } while (iVar14 < (int)uVar13);
        }
      }
    }
    else if (uVar12 < 0x3120) {
      if (uVar12 == 0x3012) {
        assign((CImg<unsigned_char> *)local_58,size_x,uVar13,uVar16,size_z);
        uVar13 = this->_spectrum;
        switch(uVar13) {
        case 1:
          lVar10 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
          if (lVar10 != 0) {
            puVar23 = this->_data;
            lVar18 = 0;
            do {
              local_40[lVar18] = puVar23[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar10 - lVar18 != 0);
          }
          break;
        case 2:
          lVar10 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
          if (lVar10 != 0) {
            puVar23 = this->_data;
            lVar18 = 0;
            do {
              local_40[lVar18 * 2] = puVar23[lVar18];
              local_40[lVar18 * 2 + 1] = puVar23[lVar18 + lVar10];
              lVar18 = lVar18 + 1;
            } while (lVar18 != lVar10);
          }
          break;
        case 3:
          lVar10 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
          if (lVar10 != 0) {
            puVar23 = this->_data;
            lVar18 = 0;
            puVar8 = local_40;
            do {
              *puVar8 = puVar23[lVar18];
              puVar8[1] = puVar23[lVar18 + lVar10];
              puVar8[2] = puVar23[lVar18 + lVar10 * 2];
              puVar8 = puVar8 + 3;
              lVar18 = lVar18 + 1;
            } while (lVar18 != lVar10);
          }
          break;
        case 4:
          lVar10 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
          if (lVar10 != 0) {
            puVar23 = this->_data;
            lVar18 = 0;
            do {
              local_40[lVar18 * 4] = puVar23[lVar18];
              local_40[lVar18 * 4 + 1] = puVar23[lVar18 + lVar10];
              local_40[lVar18 * 4 + 2] = puVar23[lVar18 + lVar10 * 2];
              local_40[lVar18 * 4 + 3] = puVar23[lVar18 + lVar10 * 3];
              lVar18 = lVar18 + 1;
            } while (lVar18 != lVar10);
          }
          break;
        default:
          if (0 < (int)uVar13) {
            uVar16 = this->_depth;
            iVar14 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar13 = this->_height;
                lVar10 = 0;
                do {
                  if (0 < (int)uVar13) {
                    uVar16 = this->_width;
                    lVar18 = 0;
                    do {
                      if (0 < (int)uVar16) {
                        lVar21 = 0;
                        do {
                          local_40[(ulong)(uint)local_58._8_4_ *
                                   (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ *
                                   lVar10 + (ulong)(uint)(local_58._0_4_ * (int)lVar21 + iVar14) +
                                            (ulong)(uint)local_58._4_4_ *
                                            (ulong)(uint)local_58._0_4_ * lVar18] = puVar23[lVar21];
                          uVar16 = this->_width;
                          lVar21 = lVar21 + 1;
                        } while ((int)lVar21 < (int)uVar16);
                        uVar13 = this->_height;
                        puVar23 = puVar23 + lVar21;
                      }
                      lVar18 = lVar18 + 1;
                    } while (lVar18 < (int)uVar13);
                    uVar16 = this->_depth;
                  }
                  lVar10 = lVar10 + 1;
                } while (lVar10 < (int)uVar16);
                uVar13 = this->_spectrum;
              }
              iVar14 = iVar14 + 1;
            } while (iVar14 < (int)uVar13);
          }
        }
      }
      else if (uVar12 == 0x3021) {
        assign((CImg<unsigned_char> *)local_58,size_x,uVar13,size_z,uVar16);
        uVar13 = this->_spectrum;
        if (0 < (int)uVar13) {
          uVar16 = this->_depth;
          iVar14 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar13 = this->_height;
              lVar10 = 0;
              do {
                if (0 < (int)uVar13) {
                  uVar16 = this->_width;
                  lVar18 = 0;
                  do {
                    if (0 < (int)uVar16) {
                      lVar21 = 0;
                      do {
                        local_40[(ulong)(uint)local_58._8_4_ *
                                 (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ * lVar18
                                 + (ulong)(uint)(local_58._0_4_ * (int)lVar21 + iVar14) +
                                   (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ *
                                   lVar10] = puVar23[lVar21];
                        uVar16 = this->_width;
                        lVar21 = lVar21 + 1;
                      } while ((int)lVar21 < (int)uVar16);
                      uVar13 = this->_height;
                      puVar23 = puVar23 + lVar21;
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar18 < (int)uVar13);
                  uVar16 = this->_depth;
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 < (int)uVar16);
              uVar13 = this->_spectrum;
            }
            iVar14 = iVar14 + 1;
          } while (iVar14 < (int)uVar13);
        }
      }
      else if (uVar12 == 0x3102) {
        assign((CImg<unsigned_char> *)local_58,size_x,uVar16,uVar13,size_z);
        uVar13 = this->_spectrum;
        if (0 < (int)uVar13) {
          uVar16 = this->_depth;
          iVar14 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar13 = this->_height;
              lVar10 = 0;
              lVar18 = 0;
              do {
                if (0 < (int)uVar13) {
                  uVar19 = (ulong)this->_width;
                  iVar17 = 0;
                  do {
                    if (0 < (int)uVar19) {
                      lVar22 = 0;
                      lVar21 = lVar10;
                      do {
                        local_40[lVar21 + (ulong)(uint)(local_58._0_4_ * iVar17 + iVar14)] =
                             puVar23[lVar22];
                        lVar22 = lVar22 + 1;
                        uVar19 = (ulong)(int)this->_width;
                        lVar21 = lVar21 + (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
                      } while (lVar22 < (long)uVar19);
                      uVar13 = this->_height;
                      puVar23 = puVar23 + lVar22;
                    }
                    iVar17 = iVar17 + 1;
                  } while (iVar17 < (int)uVar13);
                  uVar16 = this->_depth;
                }
                lVar18 = lVar18 + 1;
                lVar10 = lVar10 + (ulong)(uint)local_58._8_4_ *
                                  (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
              } while (lVar18 < (int)uVar16);
              uVar13 = this->_spectrum;
            }
            iVar14 = iVar14 + 1;
          } while (iVar14 < (int)uVar13);
        }
      }
    }
    else if (uVar12 == 0x3120) {
      assign((CImg<unsigned_char> *)local_58,size_x,uVar16,size_z,uVar13);
      uVar13 = this->_spectrum;
      if (0 < (int)uVar13) {
        uVar16 = this->_depth;
        iVar14 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar13 = this->_height;
            lVar10 = 0;
            lVar18 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar19 = (ulong)this->_width;
                iVar17 = 0;
                do {
                  if (0 < (int)uVar19) {
                    lVar22 = 0;
                    lVar21 = lVar10;
                    do {
                      local_40[lVar21 + (ulong)(uint)(local_58._0_4_ * iVar17 + iVar14)] =
                           puVar23[lVar22];
                      lVar22 = lVar22 + 1;
                      uVar19 = (ulong)(int)this->_width;
                      lVar21 = lVar21 + (ulong)(uint)local_58._8_4_ *
                                        (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
                    } while (lVar22 < (long)uVar19);
                    uVar13 = this->_height;
                    puVar23 = puVar23 + lVar22;
                  }
                  iVar17 = iVar17 + 1;
                } while (iVar17 < (int)uVar13);
                uVar16 = this->_depth;
              }
              lVar18 = lVar18 + 1;
              lVar10 = lVar10 + (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
            } while (lVar18 < (int)uVar16);
            uVar13 = this->_spectrum;
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < (int)uVar13);
      }
    }
    else if (uVar12 == 0x3201) {
      assign((CImg<unsigned_char> *)local_58,size_x,size_z,uVar13,uVar16);
      uVar13 = this->_spectrum;
      if (0 < (int)uVar13) {
        uVar16 = this->_depth;
        iVar14 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar13 = this->_height;
            iVar17 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar19 = (ulong)this->_width;
                lVar10 = 0;
                lVar18 = 0;
                do {
                  if (0 < (int)uVar19) {
                    lVar22 = 0;
                    lVar21 = lVar10;
                    do {
                      local_40[lVar21 + (ulong)(uint)(local_58._0_4_ * iVar17 + iVar14)] =
                           puVar23[lVar22];
                      lVar22 = lVar22 + 1;
                      uVar19 = (ulong)(int)this->_width;
                      lVar21 = lVar21 + (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
                    } while (lVar22 < (long)uVar19);
                    uVar13 = this->_height;
                    puVar23 = puVar23 + lVar22;
                  }
                  lVar18 = lVar18 + 1;
                  lVar10 = lVar10 + (ulong)(uint)local_58._8_4_ *
                                    (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
                } while (lVar18 < (int)uVar13);
                uVar16 = this->_depth;
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 < (int)uVar16);
            uVar13 = this->_spectrum;
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < (int)uVar13);
      }
    }
    else if (uVar12 == 0x3210) {
      assign((CImg<unsigned_char> *)local_58,size_x,size_z,uVar16,uVar13);
      uVar13 = this->_spectrum;
      if (0 < (int)uVar13) {
        uVar16 = this->_depth;
        iVar14 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar13 = this->_height;
            iVar17 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar19 = (ulong)this->_width;
                lVar10 = 0;
                lVar18 = 0;
                do {
                  if (0 < (int)uVar19) {
                    lVar22 = 0;
                    lVar21 = lVar10;
                    do {
                      local_40[lVar21 + (ulong)(uint)(local_58._0_4_ * iVar17 + iVar14)] =
                           puVar23[lVar22];
                      lVar22 = lVar22 + 1;
                      uVar19 = (ulong)(int)this->_width;
                      lVar21 = lVar21 + (ulong)(uint)local_58._8_4_ *
                                        (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
                    } while (lVar22 < (long)uVar19);
                    uVar13 = this->_height;
                    puVar23 = puVar23 + lVar22;
                  }
                  lVar18 = lVar18 + 1;
                  lVar10 = lVar10 + (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
                } while (lVar18 < (int)uVar13);
                uVar16 = this->_depth;
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 < (int)uVar16);
            uVar13 = this->_spectrum;
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < (int)uVar13);
      }
    }
    goto LAB_0018d30f;
  }
  if (uVar12 < 0x1023) {
    if (uVar12 < 0x231) {
      if (uVar12 == 0x123) {
        CImg(__return_storage_ptr__,this,false);
        if ((local_48 & 1U) != 0) {
          return __return_storage_ptr__;
        }
        goto LAB_0018d348;
      }
      if (uVar12 == 0x132) {
        assign((CImg<unsigned_char> *)local_58,uVar13,uVar16,size_x,size_z);
        uVar13 = this->_spectrum;
        if (0 < (int)uVar13) {
          uVar16 = this->_depth;
          lVar10 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar13 = this->_height;
              lVar18 = 0;
              do {
                if (0 < (int)uVar13) {
                  uVar16 = this->_width;
                  iVar14 = 0;
                  do {
                    if (0 < (int)uVar16) {
                      lVar21 = 0;
                      do {
                        local_40[(ulong)(uint)local_58._8_4_ *
                                 (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ * lVar18
                                 + (ulong)(uint)(local_58._0_4_ * iVar14 + (int)lVar21) +
                                   (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ *
                                   lVar10] = puVar23[lVar21];
                        uVar16 = this->_width;
                        lVar21 = lVar21 + 1;
                      } while ((int)lVar21 < (int)uVar16);
                      uVar13 = this->_height;
                      puVar23 = puVar23 + lVar21;
                    }
                    iVar14 = iVar14 + 1;
                  } while (iVar14 < (int)uVar13);
                  uVar16 = this->_depth;
                }
                lVar18 = lVar18 + 1;
              } while (lVar18 < (int)uVar16);
              uVar13 = this->_spectrum;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < (int)uVar13);
        }
      }
      else if (uVar12 == 0x213) {
        assign((CImg<unsigned_char> *)local_58,uVar13,size_z,uVar16,size_x);
        uVar13 = this->_spectrum;
        if (0 < (int)uVar13) {
          uVar16 = this->_depth;
          lVar10 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar13 = this->_height;
              iVar14 = 0;
              do {
                if (0 < (int)uVar13) {
                  uVar16 = this->_width;
                  lVar18 = 0;
                  do {
                    if (0 < (int)uVar16) {
                      lVar21 = 0;
                      do {
                        local_40[(ulong)(uint)local_58._8_4_ *
                                 (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ * lVar10
                                 + (ulong)(uint)(local_58._0_4_ * iVar14 + (int)lVar21) +
                                   (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ *
                                   lVar18] = puVar23[lVar21];
                        uVar16 = this->_width;
                        lVar21 = lVar21 + 1;
                      } while ((int)lVar21 < (int)uVar16);
                      uVar13 = this->_height;
                      puVar23 = puVar23 + lVar21;
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar18 < (int)uVar13);
                  uVar16 = this->_depth;
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 < (int)uVar16);
              uVar13 = this->_spectrum;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < (int)uVar13);
        }
      }
    }
    else if (uVar12 == 0x231) {
      assign((CImg<unsigned_char> *)local_58,uVar13,size_z,size_x,uVar16);
      uVar13 = this->_spectrum;
      if (0 < (int)uVar13) {
        uVar16 = this->_depth;
        lVar10 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar13 = this->_height;
            iVar14 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar16 = this->_width;
                lVar18 = 0;
                do {
                  if (0 < (int)uVar16) {
                    lVar21 = 0;
                    do {
                      local_40[(ulong)(uint)local_58._8_4_ *
                               (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ * lVar18 +
                               (ulong)(uint)(local_58._0_4_ * iVar14 + (int)lVar21) +
                               (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ * lVar10] =
                           puVar23[lVar21];
                      uVar16 = this->_width;
                      lVar21 = lVar21 + 1;
                    } while ((int)lVar21 < (int)uVar16);
                    uVar13 = this->_height;
                    puVar23 = puVar23 + lVar21;
                  }
                  lVar18 = lVar18 + 1;
                } while (lVar18 < (int)uVar13);
                uVar16 = this->_depth;
              }
              iVar14 = iVar14 + 1;
            } while (iVar14 < (int)uVar16);
            uVar13 = this->_spectrum;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)uVar13);
      }
    }
    else if (uVar12 == 0x312) {
      assign((CImg<unsigned_char> *)local_58,uVar13,size_x,uVar16,size_z);
      uVar13 = this->_spectrum;
      if (0 < (int)uVar13) {
        uVar16 = this->_depth;
        iVar14 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar13 = this->_height;
            lVar10 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar16 = this->_width;
                lVar18 = 0;
                do {
                  if (0 < (int)uVar16) {
                    lVar21 = 0;
                    do {
                      local_40[(ulong)(uint)local_58._8_4_ *
                               (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ * lVar10 +
                               (ulong)(uint)(local_58._0_4_ * iVar14 + (int)lVar21) +
                               (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ * lVar18] =
                           puVar23[lVar21];
                      uVar16 = this->_width;
                      lVar21 = lVar21 + 1;
                    } while ((int)lVar21 < (int)uVar16);
                    uVar13 = this->_height;
                    puVar23 = puVar23 + lVar21;
                  }
                  lVar18 = lVar18 + 1;
                } while (lVar18 < (int)uVar13);
                uVar16 = this->_depth;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < (int)uVar16);
            uVar13 = this->_spectrum;
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < (int)uVar13);
      }
    }
    else if (uVar12 == 0x321) {
      assign((CImg<unsigned_char> *)local_58,uVar13,size_x,size_z,uVar16);
      uVar13 = this->_spectrum;
      if (0 < (int)uVar13) {
        uVar16 = this->_depth;
        iVar14 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar13 = this->_height;
            lVar10 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar16 = this->_width;
                lVar18 = 0;
                do {
                  if (0 < (int)uVar16) {
                    lVar21 = 0;
                    do {
                      local_40[(ulong)(uint)local_58._8_4_ *
                               (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ * lVar18 +
                               (ulong)(uint)(local_58._0_4_ * iVar14 + (int)lVar21) +
                               (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ * lVar10] =
                           puVar23[lVar21];
                      uVar16 = this->_width;
                      lVar21 = lVar21 + 1;
                    } while ((int)lVar21 < (int)uVar16);
                    uVar13 = this->_height;
                    puVar23 = puVar23 + lVar21;
                  }
                  lVar18 = lVar18 + 1;
                } while (lVar18 < (int)uVar13);
                uVar16 = this->_depth;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < (int)uVar16);
            uVar13 = this->_spectrum;
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < (int)uVar13);
      }
    }
    goto LAB_0018d30f;
  }
  if (uVar12 < 0x1230) {
    if (uVar12 == 0x1023) {
      assign((CImg<unsigned_char> *)local_58,uVar16,uVar13,size_z,size_x);
      uVar13 = this->_spectrum;
      if (0 < (int)uVar13) {
        uVar16 = this->_depth;
        lVar10 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar13 = this->_height;
            lVar18 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar16 = this->_width;
                iVar14 = 0;
                do {
                  if (0 < (int)uVar16) {
                    lVar21 = 0;
                    do {
                      local_40[(ulong)(uint)local_58._8_4_ *
                               (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ * lVar10 +
                               (ulong)(uint)(local_58._0_4_ * (int)lVar21 + iVar14) +
                               (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ * lVar18] =
                           puVar23[lVar21];
                      uVar16 = this->_width;
                      lVar21 = lVar21 + 1;
                    } while ((int)lVar21 < (int)uVar16);
                    uVar13 = this->_height;
                    puVar23 = puVar23 + lVar21;
                  }
                  iVar14 = iVar14 + 1;
                } while (iVar14 < (int)uVar13);
                uVar16 = this->_depth;
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < (int)uVar16);
            uVar13 = this->_spectrum;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)uVar13);
      }
    }
    else if (uVar12 == 0x1032) {
      assign((CImg<unsigned_char> *)local_58,uVar16,uVar13,size_x,size_z);
      uVar13 = this->_spectrum;
      if (0 < (int)uVar13) {
        uVar16 = this->_depth;
        lVar10 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar13 = this->_height;
            lVar18 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar16 = this->_width;
                iVar14 = 0;
                do {
                  if (0 < (int)uVar16) {
                    lVar21 = 0;
                    do {
                      local_40[(ulong)(uint)local_58._8_4_ *
                               (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ * lVar18 +
                               (ulong)(uint)(local_58._0_4_ * (int)lVar21 + iVar14) +
                               (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_ * lVar10] =
                           puVar23[lVar21];
                      uVar16 = this->_width;
                      lVar21 = lVar21 + 1;
                    } while ((int)lVar21 < (int)uVar16);
                    uVar13 = this->_height;
                    puVar23 = puVar23 + lVar21;
                  }
                  iVar14 = iVar14 + 1;
                } while (iVar14 < (int)uVar13);
                uVar16 = this->_depth;
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < (int)uVar16);
            uVar13 = this->_spectrum;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)uVar13);
      }
    }
    else if (uVar12 == 0x1203) {
      assign((CImg<unsigned_char> *)local_58,uVar16,size_z,uVar13,size_x);
      uVar13 = this->_spectrum;
      if (0 < (int)uVar13) {
        uVar16 = this->_depth;
        lVar10 = 0;
        lVar18 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar13 = this->_height;
            iVar14 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar19 = (ulong)this->_width;
                iVar17 = 0;
                do {
                  if (0 < (int)uVar19) {
                    lVar22 = 0;
                    lVar21 = lVar10;
                    do {
                      local_40[lVar21 + (ulong)(uint)(local_58._0_4_ * iVar14 + iVar17)] =
                           puVar23[lVar22];
                      lVar22 = lVar22 + 1;
                      uVar19 = (ulong)(int)this->_width;
                      lVar21 = lVar21 + (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
                    } while (lVar22 < (long)uVar19);
                    uVar13 = this->_height;
                    puVar23 = puVar23 + lVar22;
                  }
                  iVar17 = iVar17 + 1;
                } while (iVar17 < (int)uVar13);
                uVar16 = this->_depth;
              }
              iVar14 = iVar14 + 1;
            } while (iVar14 < (int)uVar16);
            uVar13 = this->_spectrum;
          }
          lVar18 = lVar18 + 1;
          lVar10 = lVar10 + (ulong)(uint)local_58._8_4_ *
                            (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
        } while (lVar18 < (int)uVar13);
      }
    }
    goto LAB_0018d30f;
  }
  if (uVar12 != 0x1230) {
    if (uVar12 == 0x1302) {
      assign((CImg<unsigned_char> *)local_58,uVar16,size_x,uVar13,size_z);
      uVar13 = this->_spectrum;
      if (0 < (int)uVar13) {
        uVar16 = this->_depth;
        iVar14 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar13 = this->_height;
            lVar10 = 0;
            lVar18 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar19 = (ulong)this->_width;
                iVar17 = 0;
                do {
                  if (0 < (int)uVar19) {
                    lVar22 = 0;
                    lVar21 = lVar10;
                    do {
                      local_40[lVar21 + (ulong)(uint)(local_58._0_4_ * iVar14 + iVar17)] =
                           puVar23[lVar22];
                      lVar22 = lVar22 + 1;
                      uVar19 = (ulong)(int)this->_width;
                      lVar21 = lVar21 + (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
                    } while (lVar22 < (long)uVar19);
                    uVar13 = this->_height;
                    puVar23 = puVar23 + lVar22;
                  }
                  iVar17 = iVar17 + 1;
                } while (iVar17 < (int)uVar13);
                uVar16 = this->_depth;
              }
              lVar18 = lVar18 + 1;
              lVar10 = lVar10 + (ulong)(uint)local_58._8_4_ *
                                (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
            } while (lVar18 < (int)uVar16);
            uVar13 = this->_spectrum;
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < (int)uVar13);
      }
    }
    else if (uVar12 == 0x1320) {
      assign((CImg<unsigned_char> *)local_58,uVar16,size_x,size_z,uVar13);
      uVar13 = this->_spectrum;
      if (0 < (int)uVar13) {
        uVar16 = this->_depth;
        iVar14 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar13 = this->_height;
            lVar10 = 0;
            lVar18 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar19 = (ulong)this->_width;
                iVar17 = 0;
                do {
                  if (0 < (int)uVar19) {
                    lVar22 = 0;
                    lVar21 = lVar10;
                    do {
                      local_40[lVar21 + (ulong)(uint)(local_58._0_4_ * iVar14 + iVar17)] =
                           puVar23[lVar22];
                      lVar22 = lVar22 + 1;
                      uVar19 = (ulong)(int)this->_width;
                      lVar21 = lVar21 + (ulong)(uint)local_58._8_4_ *
                                        (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
                    } while (lVar22 < (long)uVar19);
                    uVar13 = this->_height;
                    puVar23 = puVar23 + lVar22;
                  }
                  iVar17 = iVar17 + 1;
                } while (iVar17 < (int)uVar13);
                uVar16 = this->_depth;
              }
              lVar18 = lVar18 + 1;
              lVar10 = lVar10 + (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
            } while (lVar18 < (int)uVar16);
            uVar13 = this->_spectrum;
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < (int)uVar13);
      }
    }
    goto LAB_0018d30f;
  }
  assign((CImg<unsigned_char> *)local_58,uVar16,size_z,size_x,uVar13);
  uVar19 = (ulong)this->_width;
  switch(this->_width) {
  case 1:
    iVar14 = this->_depth * this->_height * this->_spectrum;
    if (iVar14 != 0) {
      lVar10 = 0;
      do {
        local_40[lVar10] = puVar23[lVar10];
        lVar10 = lVar10 + 1;
      } while (iVar14 != (int)lVar10);
    }
    break;
  case 2:
    iVar14 = this->_depth * this->_height * this->_spectrum;
    if (iVar14 != 0) {
      lVar10 = 0;
      do {
        local_40[lVar10] = puVar23[lVar10 * 2];
        local_40[lVar10 + (ulong)(uint)local_58._8_4_ *
                          (ulong)(uint)local_58._0_4_ * (ulong)(uint)local_58._4_4_] =
             puVar23[lVar10 * 2 + 1];
        lVar10 = lVar10 + 1;
      } while (iVar14 != (int)lVar10);
    }
    break;
  case 3:
    iVar14 = this->_depth * this->_height * this->_spectrum;
    if (iVar14 != 0) {
      lVar10 = (ulong)(uint)local_58._8_4_ *
               (ulong)(uint)local_58._0_4_ * (ulong)(uint)local_58._4_4_;
      lVar18 = 0;
      do {
        local_40[lVar18] = *puVar23;
        local_40[lVar18 + lVar10] = puVar23[1];
        local_40[lVar18 + lVar10 * 2] = puVar23[2];
        puVar23 = puVar23 + 3;
        lVar18 = lVar18 + 1;
      } while (iVar14 != (int)lVar18);
    }
    break;
  case 4:
    iVar14 = this->_depth * this->_height * this->_spectrum;
    if (iVar14 != 0) {
      lVar10 = (ulong)(uint)local_58._8_4_ *
               (ulong)(uint)local_58._0_4_ * (ulong)(uint)local_58._4_4_;
      lVar18 = 0;
      do {
        local_40[lVar18] = puVar23[lVar18 * 4];
        local_40[lVar18 + lVar10] = puVar23[lVar18 * 4 + 1];
        local_40[lVar18 + lVar10 * 2] = puVar23[lVar18 * 4 + 2];
        local_40[lVar18 + lVar10 * 3] = puVar23[lVar18 * 4 + 3];
        lVar18 = lVar18 + 1;
      } while (iVar14 != (int)lVar18);
    }
    break;
  default:
    uVar13 = this->_spectrum;
    if (0 < (int)uVar13) {
      uVar16 = this->_depth;
      lVar10 = 0;
      lVar18 = 0;
      do {
        if (0 < (int)uVar16) {
          uVar13 = this->_height;
          iVar14 = 0;
          do {
            if (0 < (int)uVar13) {
              iVar17 = 0;
              do {
                if (0 < (int)uVar19) {
                  lVar22 = 0;
                  lVar21 = lVar10;
                  do {
                    local_40[lVar21 + (ulong)(uint)(local_58._0_4_ * iVar14 + iVar17)] =
                         puVar23[lVar22];
                    lVar22 = lVar22 + 1;
                    uVar19 = (ulong)(int)this->_width;
                    lVar21 = lVar21 + (ulong)(uint)local_58._8_4_ *
                                      (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
                  } while (lVar22 < (long)uVar19);
                  uVar13 = this->_height;
                  puVar23 = puVar23 + lVar22;
                }
                iVar17 = iVar17 + 1;
              } while (iVar17 < (int)uVar13);
              uVar16 = this->_depth;
            }
            iVar14 = iVar14 + 1;
          } while (iVar14 < (int)uVar16);
          uVar13 = this->_spectrum;
        }
        lVar18 = lVar18 + 1;
        lVar10 = lVar10 + (ulong)(uint)local_58._4_4_ * (ulong)(uint)local_58._0_4_;
      } while (lVar18 < (int)uVar13);
    }
    __return_storage_ptr__->_width = local_58._0_4_;
    __return_storage_ptr__->_height = local_58._4_4_;
    __return_storage_ptr__->_depth = local_58._8_4_;
    __return_storage_ptr__->_spectrum = local_58._12_4_;
    goto LAB_0018d32f;
  }
LAB_0018d30f:
  if (local_40 == (uchar *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar20 = "non-";
    if (this->_is_shared != false) {
      pcVar20 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::permute_axes(): Invalid specified axes order \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar20,"unsigned char",axes_order);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  __return_storage_ptr__->_width = local_58._0_4_;
  __return_storage_ptr__->_height = local_58._4_4_;
  __return_storage_ptr__->_depth = local_58._8_4_;
  __return_storage_ptr__->_spectrum = local_58._12_4_;
LAB_0018d32f:
  local_58 = (undefined1  [16])0x0;
  __return_storage_ptr__->_data = local_40;
  local_40 = (uchar *)0x0;
  __return_storage_ptr__->_is_shared = local_48;
  local_48 = false;
LAB_0018d348:
  if (local_40 != (uchar *)0x0) {
    operator_delete__(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<t> _permute_axes(const char *const axes_order, const t&) const {
      if (is_empty() || !axes_order) return CImg<t>(*this,false);
      CImg<t> res;
      const T* ptrs = _data;
      unsigned char s_code[4] = { 0,1,2,3 }, n_code[4] = { 0 };
      for (unsigned int l = 0; axes_order[l]; ++l) {
        int c = cimg::lowercase(axes_order[l]);
        if (l>=4 || (c!='x' && c!='y' && c!='z' && c!='c')) { *s_code = 4; break; }
        else { ++n_code[c%=4]; s_code[l] = c; }
      }
      if (*axes_order && *s_code<4 && *n_code<=1 && n_code[1]<=1 && n_code[2]<=1 && n_code[3]<=1) {
        const unsigned int code = (s_code[0]<<12) | (s_code[1]<<8) | (s_code[2]<<4) | (s_code[3]);
        ulongT wh, whd;
        switch (code) {
        case 0x0123 : // xyzc
          return +*this;
        case 0x0132 : // xycz
          res.assign(_width,_height,_spectrum,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,y,c,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0213 : // xzyc
          res.assign(_width,_depth,_height,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,z,y,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0231 : // xzcy
          res.assign(_width,_depth,_spectrum,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,z,c,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0312 : // xcyz
          res.assign(_width,_spectrum,_height,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,c,y,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0321 : // xczy
          res.assign(_width,_spectrum,_depth,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,c,z,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1023 : // yxzc
          res.assign(_height,_width,_depth,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,x,z,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1032 : // yxcz
          res.assign(_height,_width,_spectrum,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,x,c,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1203 : // yzxc
          res.assign(_height,_depth,_width,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,z,x,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1230 : // yzcx
          res.assign(_height,_depth,_spectrum,_width);
          switch (_width) {
          case 1 : {
            t *ptr_r = res.data(0,0,0,0);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)*(ptrs++);
            }
          } break;
          case 2 : {
            t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              ptrs+=2;
            }
          } break;
          case 3 : { // Optimization for the classical conversion from interleaved RGB to planar RGB
            t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              *(ptr_b++) = (t)ptrs[2];
              ptrs+=3;
            }
          } break;
          case 4 : { // Optimization for the classical conversion from interleaved RGBA to planar RGBA
            t
              *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1),
              *ptr_b = res.data(0,0,0,2), *ptr_a = res.data(0,0,0,3);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              *(ptr_b++) = (t)ptrs[2];
              *(ptr_a++) = (t)ptrs[3];
              ptrs+=4;
            }
          } break;
          default : {
            wh = (ulongT)res._width*res._height; whd = wh*res._depth;
            cimg_forXYZC(*this,x,y,z,c) res(y,z,c,x,wh,whd) = *(ptrs++);
            return res;
          }
          }
          break;
        case 0x1302 : // ycxz
          res.assign(_height,_spectrum,_width,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,c,x,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1320 : // yczx
          res.assign(_height,_spectrum,_depth,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,c,z,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2013 : // zxyc
          res.assign(_depth,_width,_height,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,x,y,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2031 : // zxcy
          res.assign(_depth,_width,_spectrum,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,x,c,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2103 : // zyxc
          res.assign(_depth,_height,_width,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,y,x,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2130 : // zycx
          res.assign(_depth,_height,_spectrum,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,y,c,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2301 : // zcxy
          res.assign(_depth,_spectrum,_width,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,c,x,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2310 : // zcyx
          res.assign(_depth,_spectrum,_height,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,c,y,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3012 : // cxyz
          res.assign(_spectrum,_width,_height,_depth);
          switch (_spectrum) {
          case 1 : {
            const T *ptr_r = data(0,0,0,0);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) *(ptrd++) = (t)*(ptr_r++);
          } break;
          case 2 : {
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd+=2;
            }
          } break;
          case 3 : { // Optimization for the classical conversion from planar RGB to interleaved RGB
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd[2] = (t)*(ptr_b++);
              ptrd+=3;
            }
          } break;
          case 4 : { // Optimization for the classical conversion from planar RGBA to interleaved RGBA
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2), *ptr_a = data(0,0,0,3);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd[2] = (t)*(ptr_b++);
              ptrd[3] = (t)*(ptr_a++);
              ptrd+=4;
            }
          } break;
          default : {
            wh = (ulongT)res._width*res._height; whd = wh*res._depth;
            cimg_forXYZC(*this,x,y,z,c) res(c,x,y,z,wh,whd) = (t)*(ptrs++);
          }
          }
          break;
        case 0x3021 : // cxzy
          res.assign(_spectrum,_width,_depth,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,x,z,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3102 : // cyxz
          res.assign(_spectrum,_height,_width,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,y,x,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3120 : // cyzx
          res.assign(_spectrum,_height,_depth,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,y,z,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3201 : // czxy
          res.assign(_spectrum,_depth,_width,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,z,x,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3210 : // czyx
          res.assign(_spectrum,_depth,_height,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,z,y,x,wh,whd) = (t)*(ptrs++);
          break;
        }
      }
      if (!res)
        throw CImgArgumentException(_cimg_instance
                                    "permute_axes(): Invalid specified axes order '%s'.",
                                    cimg_instance,
                                    axes_order);
      return res;
    }